

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPortDataTransfer.cpp
# Opt level: O2

void __thiscall CPortDataTransfer::Execute(CPortDataTransfer *this)

{
  ushort uVar1;
  int __fd;
  int iVar2;
  allocator local_6d;
  int opt;
  sockaddr_in clientaddr;
  string ret;
  sockaddr_in bindaddr;
  
  __fd = socket(2,1,0);
  clientaddr.sin_addr.s_addr = inet_addr((this->m_RemoteIp)._M_dataplus._M_p);
  uVar1 = (ushort)this->m_RemotePort;
  clientaddr.sin_port = uVar1 << 8 | uVar1 >> 8;
  clientaddr.sin_family = 2;
  bindaddr.sin_family = 2;
  bindaddr.sin_port = 0x8913;
  bindaddr.sin_addr.s_addr = 0;
  opt = 1;
  setsockopt(__fd,1,2,&opt,4);
  iVar2 = bind(__fd,(sockaddr *)&bindaddr,0x10);
  if (iVar2 == -1) {
    perror("bind error ");
  }
  iVar2 = connect(__fd,(sockaddr *)&clientaddr,0x10);
  if (iVar2 == 0) {
    DispatchCommand(this,__fd);
  }
  else {
    std::__cxx11::string::string((string *)&ret,"425 Failed to establish connection.\r\n",&local_6d)
    ;
    ControlSockSendMsg(this,&ret);
    std::__cxx11::string::~string((string *)&ret);
  }
  close(__fd);
  ~CPortDataTransfer(this);
  operator_delete(this);
  return;
}

Assistant:

void CPortDataTransfer::Execute() {
    int clientsock = socket(AF_INET,SOCK_STREAM,0);
    struct sockaddr_in clientaddr,bindaddr;
    clientaddr.sin_addr.s_addr = inet_addr(m_RemoteIp.c_str());
    clientaddr.sin_port = htons(m_RemotePort);
    clientaddr.sin_family = AF_INET;

    bindaddr.sin_port = htons(5001);
    bindaddr.sin_family = AF_INET;
    bindaddr.sin_addr.s_addr = INADDR_ANY;

    int opt = 1;
    setsockopt(clientsock, SOL_SOCKET, SO_REUSEADDR, (const void *)&opt, sizeof(opt));

    if(bind(clientsock,(struct sockaddr*)&bindaddr,sizeof(bindaddr)) == -1){
        perror("bind error ");
    }


    if(0 == connect(clientsock,(struct sockaddr*)&clientaddr,sizeof(clientaddr))){
        int ret = DispatchCommand(clientsock);
    }
    else{
        string ret = "425 Failed to establish connection.\r\n";
        ControlSockSendMsg(ret);
    }

    close(clientsock);
    delete this;
}